

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::Data>
* __thiscall
density::
conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>::
start_reentrant_emplace<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>>::Data>
          (reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::Data>
           *__return_storage_ptr__,
          conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>
          *this)

{
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::Data>
  local_80;
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::Data>
  local_50;
  undefined1 local_38 [8];
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::Data>
  put_transaction;
  lock_guard<std::mutex> lock;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&put_transaction.m_put_data.m_user_storage,(mutex_type *)this
            );
  heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>::
  start_reentrant_emplace<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>>::Data>
            (&local_50,
             (heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>
              *)(this + 0x28));
  heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>::
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>>::Data>
  ::
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>>::Data,void>
            ((reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>>::Data>
              *)local_38,&local_50);
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::Data>
  ::~reentrant_put_transaction(&local_50);
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::Data>
  ::reentrant_put_transaction
            (&local_80,0,
             (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
              *)this,(reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::Data>
                      *)local_38);
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>>::Data>
  ::
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>>::Data,void>
            ((reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>>::Data>
              *)__return_storage_ptr__,&local_80);
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::Data>
  ::~reentrant_put_transaction(&local_80);
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::Data>
  ::~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::Data>
              *)local_38);
  std::lock_guard<std::mutex>::~lock_guard
            ((lock_guard<std::mutex> *)&put_transaction.m_put_data.m_user_storage);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            std::lock_guard<std::mutex> lock(m_mutex);
            auto put_transaction = m_queue.template start_reentrant_emplace<ELEMENT_TYPE>(
              std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            return reentrant_put_transaction<ELEMENT_TYPE>(
              PrivateType(), this, std::move(put_transaction));
        }